

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,UnqualifiedName *name)

{
  Expression *pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string local_70;
  CompileMessage local_50;
  UnqualifiedName *local_18;
  UnqualifiedName *name_local;
  PostResolutionChecks *this_local;
  
  local_18 = name;
  name_local = (UnqualifiedName *)this;
  ASTVisitor::visit(&this->super_ASTVisitor,name);
  pEVar1 = &local_18->super_Expression;
  AST::UnqualifiedName::toString_abi_cxx11_(&local_70,local_18);
  Errors::unresolvedSymbol<std::__cxx11::string>(&local_50,(Errors *)&local_70,args);
  AST::Context::throwError(&(pEVar1->super_Statement).super_ASTObject.context,&local_50,false);
}

Assistant:

void visit (AST::UnqualifiedName& name) override
        {
            super::visit (name);
            name.context.throwError (Errors::unresolvedSymbol (name.toString()));
        }